

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O2

ExprBase * AnalyzeNumber(ExpressionContext *ctx,SynNumber *syntax)

{
  InplaceStr *this;
  bool bVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  _func_int **pp_Var6;
  ExprBase *pEVar7;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  ExprBase *extraout_RAX;
  ulong uVar8;
  char *pcVar9;
  TypeBase *pTVar10;
  char *pcVar11;
  char *pos;
  SynNumber *rhs;
  undefined8 uVar12;
  char *in_R9;
  __va_list_tag _Stack_120;
  undefined1 auStack_100 [32];
  undefined8 uStack_e0;
  char *pcStack_d8;
  code *pcStack_50;
  _func_int **local_40;
  undefined1 local_38 [16];
  undefined4 extraout_var;
  
  pcVar9 = (syntax->value).begin;
  uVar5 = (long)(syntax->value).end - (long)pcVar9;
  uVar4 = (uint)uVar5;
  if ((uVar4 < 2) || (pcVar9[1] != 'x')) {
    bVar1 = false;
    for (uVar8 = 0; (uVar5 & 0xffffffff) != uVar8; uVar8 = uVar8 + 1) {
      if ((pcVar9[uVar8] == 'e') || (pcVar9[uVar8] == '.')) {
        bVar1 = true;
      }
    }
    this = &syntax->suffix;
    if (bVar1) {
      rhs = (SynNumber *)local_38;
      local_38._0_8_ = "f";
      local_38._8_8_ = "";
      pcStack_50 = (code *)0x14fed3;
      bVar1 = InplaceStr::operator==(this,(InplaceStr *)rhs);
      if (bVar1) {
        pcStack_50 = (code *)0x14fee4;
        local_40 = (_func_int **)
                   anon_unknown.dwarf_94284::ParseDouble
                             ((ExpressionContext *)(syntax->value).begin,(char *)rhs);
        pcStack_50 = (code *)0x14fefa;
        iVar2 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
        pEVar7 = (ExprBase *)CONCAT44(extraout_var_00,iVar2);
        pTVar10 = ctx->typeFloat;
        local_40 = (_func_int **)(double)(float)(double)local_40;
        pEVar7->typeID = 7;
        pEVar7->source = &syntax->super_SynBase;
        pEVar7->type = pTVar10;
        pEVar7->next = (ExprBase *)0x0;
        pEVar7->listed = false;
        pEVar7->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00223528;
      }
      else {
        pcVar9 = (syntax->suffix).begin;
        pcVar11 = (syntax->suffix).end;
        if (pcVar9 != pcVar11) {
          pcStack_50 = (code *)0x14fff8;
          rhs = syntax;
          anon_unknown.dwarf_94284::ReportAt
                    (ctx,&syntax->super_SynBase,pcVar9,"ERROR: unknown number suffix \'%.*s\'",
                     (ulong)(uint)((int)pcVar11 - (int)pcVar9),pcVar9);
        }
        pcStack_50 = (code *)0x150001;
        local_40 = (_func_int **)
                   anon_unknown.dwarf_94284::ParseDouble
                             ((ExpressionContext *)(syntax->value).begin,(char *)rhs);
        pcStack_50 = (code *)0x150017;
        iVar2 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
        pEVar7 = (ExprBase *)CONCAT44(extraout_var_02,iVar2);
        pTVar10 = ctx->typeDouble;
        pEVar7->typeID = 7;
        pEVar7->source = &syntax->super_SynBase;
        pEVar7->type = pTVar10;
        pEVar7->next = (ExprBase *)0x0;
        pEVar7->listed = false;
        pEVar7->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00223528;
      }
      pEVar7[1]._vptr_ExprBase = local_40;
      return pEVar7;
    }
    local_38._0_8_ = "b";
    local_38._8_8_ = "";
    pcStack_50 = (code *)0x14ff54;
    bVar1 = InplaceStr::operator==(this,(InplaceStr *)local_38);
    if (bVar1) {
      pcVar11 = (syntax->value).begin;
      uVar4 = 0;
      do {
        uVar3 = uVar4;
        uVar4 = uVar3 + 1;
      } while (pcVar11[uVar3] == '0');
      pcVar9 = (syntax->value).end;
      if (0x40 < (int)((((int)pcVar9 - (int)pcVar11) - (uVar3 + 1)) + 1)) {
        pcStack_50 = (code *)0x14ff93;
        anon_unknown.dwarf_94284::ReportAt
                  (ctx,&syntax->super_SynBase,pcVar11,"ERROR: overflow in binary constant");
        pcVar11 = (syntax->value).begin;
        pcVar9 = (syntax->value).end;
      }
      pcVar11 = pcVar11 + uVar3;
      iVar2 = 2;
    }
    else {
      local_38._0_8_ = "l";
      local_38._8_8_ = "";
      pcStack_50 = (code *)0x150072;
      bVar1 = InplaceStr::operator==(this,(InplaceStr *)local_38);
      if (bVar1) {
        pcVar9 = (syntax->value).end;
        uVar12 = 10;
        pcStack_50 = (code *)0x15008d;
        pp_Var6 = (_func_int **)
                  anon_unknown.dwarf_94284::ParseLong
                            (ctx,&syntax->super_SynBase,(syntax->value).begin,pcVar9,10);
        if ((long)pp_Var6 < 0) {
LAB_001501b2:
          pcStack_50 = anon_unknown.dwarf_94284::ReportAt;
          anon_unknown.dwarf_94284::StopAt(ctx,&syntax->super_SynBase,(syntax->value).begin,pcVar9);
          _Stack_120.reg_save_area = auStack_100;
          _Stack_120.overflow_arg_area = &local_40;
          _Stack_120.gp_offset = 0x20;
          _Stack_120.fp_offset = 0x30;
          uStack_e0 = uVar12;
          pcStack_d8 = in_R9;
          anon_unknown.dwarf_94284::ReportAt(ctx,&syntax->super_SynBase,pos,pcVar9,&_Stack_120);
          return extraout_RAX;
        }
        pcStack_50 = (code *)0x1500a9;
        iVar2 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
        pEVar7 = (ExprBase *)CONCAT44(extraout_var_03,iVar2);
        goto LAB_001500a9;
      }
      pcVar9 = (syntax->suffix).begin;
      pcVar11 = (syntax->suffix).end;
      if (pcVar9 != pcVar11) {
        pcStack_50 = (code *)0x1500dc;
        anon_unknown.dwarf_94284::ReportAt
                  (ctx,&syntax->super_SynBase,pcVar9,"ERROR: unknown number suffix \'%.*s\'",
                   (ulong)(uint)((int)pcVar11 - (int)pcVar9));
        in_R9 = pcVar9;
      }
      pcVar11 = (syntax->value).begin;
      pcVar9 = (syntax->value).end;
      if ((((uint)((int)pcVar9 - (int)pcVar11) < 2) || (*pcVar11 != '0')) ||
         (9 < (byte)(pcVar11[1] - 0x30U))) {
        uVar12 = 10;
        pcStack_50 = (code *)0x15015d;
        pp_Var6 = (_func_int **)
                  anon_unknown.dwarf_94284::ParseLong(ctx,&syntax->super_SynBase,pcVar11,pcVar9,10);
        if ((_func_int **)(long)(int)pp_Var6 != pp_Var6) goto LAB_001501b2;
        pcStack_50 = (code *)0x150178;
        iVar2 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
        pEVar7 = (ExprBase *)CONCAT44(extraout_var_04,iVar2);
        goto LAB_00150178;
      }
      uVar4 = 0;
      do {
        uVar5 = (ulong)uVar4;
        uVar4 = uVar4 + 1;
      } while (pcVar11[uVar5] == '0');
      iVar2 = (int)pcVar9 - (int)pcVar11;
      if ((0x16 < (int)((iVar2 - uVar4) + 1)) ||
         ((iVar2 - 0x15U == uVar4 && (pcVar11[uVar5] != '1')))) {
        pcStack_50 = (code *)0x15013f;
        anon_unknown.dwarf_94284::ReportAt
                  (ctx,&syntax->super_SynBase,pcVar11,"ERROR: overflow in octal constant");
        pcVar11 = (syntax->value).begin;
        pcVar9 = (syntax->value).end;
      }
      iVar2 = 8;
    }
    pcStack_50 = (code *)0x14ffad;
    pp_Var6 = (_func_int **)
              anon_unknown.dwarf_94284::ParseLong(ctx,&syntax->super_SynBase,pcVar11,pcVar9,iVar2);
    pcStack_50 = (code *)0x14ffc3;
    iVar2 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
    pEVar7 = (ExprBase *)CONCAT44(extraout_var_01,iVar2);
    if ((_func_int **)(long)(int)pp_Var6 == pp_Var6) goto LAB_00150178;
  }
  else {
    if (uVar4 == 2) {
      pcStack_50 = (code *)0x14fdb2;
      anon_unknown.dwarf_94284::ReportAt
                (ctx,&syntax->super_SynBase,pcVar9 + 2,"ERROR: \'0x\' must be followed by number");
    }
    local_38._0_8_ = "l";
    local_38._8_8_ = "";
    pcStack_50 = (code *)0x14fdd5;
    bVar1 = InplaceStr::operator==(&syntax->suffix,(InplaceStr *)local_38);
    if (!bVar1) {
      pcVar9 = (syntax->suffix).begin;
      pcVar11 = (syntax->suffix).end;
      if (pcVar9 != pcVar11) {
        pcStack_50 = (code *)0x14fe02;
        anon_unknown.dwarf_94284::ReportAt
                  (ctx,&syntax->super_SynBase,pcVar9,"ERROR: unknown number suffix \'%.*s\'",
                   (ulong)(uint)((int)pcVar11 - (int)pcVar9),pcVar9);
      }
    }
    pcVar9 = (syntax->value).begin;
    iVar2 = (int)pcVar9 + 1;
    uVar4 = 2;
    do {
      uVar3 = uVar4;
      iVar2 = iVar2 + 1;
      uVar4 = uVar3 + 1;
    } while (pcVar9[uVar3] == '0');
    pcVar11 = (syntax->value).end;
    if (0x10 < (int)pcVar11 - iVar2) {
      pcStack_50 = (code *)0x14fe3b;
      anon_unknown.dwarf_94284::ReportAt
                (ctx,&syntax->super_SynBase,pcVar9,"ERROR: overflow in hexadecimal constant");
      pcVar9 = (syntax->value).begin;
      pcVar11 = (syntax->value).end;
    }
    pcStack_50 = (code *)0x14fe55;
    pp_Var6 = (_func_int **)
              anon_unknown.dwarf_94284::ParseLong
                        (ctx,&syntax->super_SynBase,pcVar9 + uVar3,pcVar11,0x10);
    pcStack_50 = (code *)0x14fe74;
    iVar2 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
    pEVar7 = (ExprBase *)CONCAT44(extraout_var,iVar2);
    if (!bVar1 && (_func_int **)(long)(int)pp_Var6 == pp_Var6) {
LAB_00150178:
      pTVar10 = ctx->typeInt;
      goto LAB_0015017f;
    }
  }
LAB_001500a9:
  pTVar10 = ctx->typeLong;
LAB_0015017f:
  pEVar7->typeID = 6;
  pEVar7->source = &syntax->super_SynBase;
  pEVar7->type = pTVar10;
  pEVar7->next = (ExprBase *)0x0;
  pEVar7->listed = false;
  pEVar7->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_002234f0;
  pEVar7[1]._vptr_ExprBase = pp_Var6;
  return pEVar7;
}

Assistant:

ExprBase* AnalyzeNumber(ExpressionContext &ctx, SynNumber *syntax)
{
	InplaceStr &value = syntax->value;

	// Hexadecimal
	if(value.length() > 1 && value.begin[1] == 'x')
	{
		if(value.length() == 2)
			ReportAt(ctx, syntax, value.begin + 2, "ERROR: '0x' must be followed by number");

		bool forceLong = false;

		if(syntax->suffix == InplaceStr("l"))
			forceLong = true;
		else if(!syntax->suffix.empty())
			ReportAt(ctx, syntax, syntax->suffix.begin, "ERROR: unknown number suffix '%.*s'", syntax->suffix.length(), syntax->suffix.begin);

		// Skip 0x
		unsigned pos = 2;

		// Skip leading zeros
		while(value.begin[pos] == '0')
			pos++;

		if(int(value.length() - pos) > 16)
			ReportAt(ctx, syntax, value.begin, "ERROR: overflow in hexadecimal constant");

		long long num = (long long)ParseLong(ctx, syntax, value.begin + pos, value.end, 16);

		// If number overflows integer number, create long number
		if(!forceLong && int(num) == num)
			return new (ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(syntax, ctx.typeInt, num);

		return new (ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(syntax, ctx.typeLong, num);
	}

	bool isFP = false;

	for(unsigned i = 0; i < value.length(); i++)
	{
		if(value.begin[i] == '.' || value.begin[i] == 'e')
			isFP = true;
	}

	if(!isFP)
	{
		if(syntax->suffix == InplaceStr("b"))
		{
			unsigned pos = 0;

			// Skip leading zeros
			while(value.begin[pos] == '0')
				pos++;

			if(int(value.length() - pos) > 64)
				ReportAt(ctx, syntax, value.begin, "ERROR: overflow in binary constant");

			long long num = (long long)ParseLong(ctx, syntax, value.begin + pos, value.end, 2);

			// If number overflows integer number, create long number
			if(int(num) == num)
				return new (ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(syntax, ctx.typeInt, num);

			return new (ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(syntax, ctx.typeLong, num);
		}
		else if(syntax->suffix == InplaceStr("l"))
		{
			unsigned long long num = ParseLong(ctx, syntax, value.begin, value.end, 10);

			if(num > 9223372036854775807ull)
				StopAt(ctx, syntax, value.begin, "ERROR: overflow in integer constant");

			return new (ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(syntax, ctx.typeLong, (long long)num);
		}
		else if(!syntax->suffix.empty())
		{
			ReportAt(ctx, syntax, syntax->suffix.begin, "ERROR: unknown number suffix '%.*s'", syntax->suffix.length(), syntax->suffix.begin);
		}

		if(value.length() > 1 && value.begin[0] == '0' && isDigit(value.begin[1]))
		{
			unsigned pos = 0;

			// Skip leading zeros
			while(value.begin[pos] == '0')
				pos++;

			if(int(value.length() - pos) > 22 || (int(value.length() - pos) > 21 && value.begin[pos] != '1'))
				ReportAt(ctx, syntax, value.begin, "ERROR: overflow in octal constant");

			long long num = (long long)ParseLong(ctx,syntax,  value.begin, value.end, 8);

			// If number overflows integer number, create long number
			if(int(num) == num)
				return new (ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(syntax, ctx.typeInt, num);

			return new (ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(syntax, ctx.typeLong, num);
		}

		long long num = (long long)ParseLong(ctx, syntax, value.begin, value.end, 10);

		if(int(num) != num)
			StopAt(ctx, syntax, value.begin, "ERROR: overflow in integer constant");

		return new (ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(syntax, ctx.typeInt, num);
	}

	if(syntax->suffix == InplaceStr("f"))
	{
		double num = ParseDouble(ctx, value.begin);

		return new (ctx.get<ExprRationalLiteral>()) ExprRationalLiteral(syntax, ctx.typeFloat, float(num));
	}
	else if(!syntax->suffix.empty())
	{
		ReportAt(ctx, syntax, syntax->suffix.begin, "ERROR: unknown number suffix '%.*s'", syntax->suffix.length(), syntax->suffix.begin);
	}

	double num = ParseDouble(ctx, value.begin);

	return new (ctx.get<ExprRationalLiteral>()) ExprRationalLiteral(syntax, ctx.typeDouble, num);
}